

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportTryCompileFileGenerator::GenerateMainFile(cmExportTryCompileFileGenerator *this,ostream *os)

{
  bool bVar1;
  reference ppcVar2;
  pair<std::_Rb_tree_const_iterator<const_cmTarget_*>,_bool> pVar3;
  allocator local_2e1;
  string local_2e0;
  string local_2c0;
  allocator local_299;
  string local_298;
  string local_278;
  allocator local_251;
  string local_250;
  string local_230;
  allocator local_209;
  string local_208;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  string local_1a0;
  allocator local_179;
  string local_178;
  string local_158;
  allocator local_131;
  string local_130;
  string local_110;
  undefined1 local_f0 [8];
  ImportPropertyMap properties;
  value_type local_80;
  cmTarget *te;
  set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_> emittedDeps;
  set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_> emitted;
  ostream *os_local;
  cmExportTryCompileFileGenerator *this_local;
  
  std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::set
            ((set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
              *)&emittedDeps._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::set
            ((set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
              *)&te);
  while (bVar1 = std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::empty
                           (&this->Exports), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppcVar2 = std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::back(&this->Exports)
    ;
    local_80 = *ppcVar2;
    std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::pop_back(&this->Exports);
    pVar3 = std::
            set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::
            insert((set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                    *)&emittedDeps._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_80);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pVar3 = std::
              set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
              ::insert((set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                        *)&te,&local_80);
      properties._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pVar3.first._M_node;
      cmExportFileGenerator::GenerateImportTargetCode
                (&this->super_cmExportFileGenerator,os,local_80);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_f0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_130,"INTERFACE_INCLUDE_DIRECTORIES",&local_131);
      FindTargets(&local_110,this,&local_130,local_80,
                  (set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                   *)&te);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_178,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_179);
      FindTargets(&local_158,this,&local_178,local_80,
                  (set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                   *)&te);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c0,"INTERFACE_COMPILE_DEFINITIONS",&local_1c1);
      FindTargets(&local_1a0,this,&local_1c0,local_80,
                  (set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                   *)&te);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_208,"INTERFACE_COMPILE_OPTIONS",&local_209);
      FindTargets(&local_1e8,this,&local_208,local_80,
                  (set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                   *)&te);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_250,"INTERFACE_AUTOUIC_OPTIONS",&local_251);
      FindTargets(&local_230,this,&local_250,local_80,
                  (set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                   *)&te);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_298,"INTERFACE_SOURCES",&local_299);
      FindTargets(&local_278,this,&local_298,local_80,
                  (set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                   *)&te);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator((allocator<char> *)&local_299);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2e0,"INTERFACE_COMPILE_FEATURES",&local_2e1);
      FindTargets(&local_2c0,this,&local_2e0,local_80,
                  (set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                   *)&te);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
      PopulateProperties(this,local_80,(ImportPropertyMap *)local_f0,
                         (set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                          *)&te);
      cmExportFileGenerator::GenerateInterfaceProperties
                (&this->super_cmExportFileGenerator,local_80,os,(ImportPropertyMap *)local_f0);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_f0);
    }
  }
  std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::~set
            ((set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
              *)&te);
  std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::~set
            ((set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
              *)&emittedDeps._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return true;
}

Assistant:

bool cmExportTryCompileFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::set<cmTarget const*> emitted;
  std::set<cmTarget const*> emittedDeps;
  while(!this->Exports.empty())
    {
    cmTarget const* te = this->Exports.back();
    this->Exports.pop_back();
    if (emitted.insert(te).second)
      {
      emittedDeps.insert(te);
      this->GenerateImportTargetCode(os, te);

      ImportPropertyMap properties;

#define FIND_TARGETS(PROPERTY) \
      this->FindTargets("INTERFACE_" #PROPERTY, te, emittedDeps);

      CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(FIND_TARGETS)

#undef FIND_TARGETS

      this->PopulateProperties(te, properties, emittedDeps);

      this->GenerateInterfaceProperties(te, os, properties);
      }
    }
  return true;
}